

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O3

void __thiscall
Parse::SMTLIB2::readDefineFun
          (SMTLIB2 *this,string *name,LExprList *iArgs,LExpr *oSort,LExpr *body,TermStack *typeArgs,
          bool recursive)

{
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ***pppDVar1;
  TermList *pTVar2;
  uint64_t uVar3;
  List<Kernel::Unit_*> *pLVar4;
  string *name_00;
  bool bVar5;
  uint uVar6;
  TermList TVar7;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  *pDVar8;
  LExpr *sExpr;
  DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
  **ppDVar9;
  DeclaredSymbol DVar10;
  anon_union_8_2_43a9448f_for_ParseResult_3 arg2;
  Formula *formula;
  Literal *pLVar11;
  undefined4 *puVar12;
  Unit *this_00;
  List<Kernel::Unit_*> *pLVar13;
  Term *pTVar14;
  ulong uVar15;
  undefined8 *puVar16;
  long *plVar17;
  TermList *pTVar18;
  size_type *psVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_8_2_43a9448f_for_ParseResult_3 **ppaVar21;
  long *plVar22;
  TermList *pTVar23;
  FixedSizeAllocator<48UL> *this_01;
  FIFO *pFVar24;
  TermList TVar25;
  SymbolType SVar26;
  Symbol *pSVar27;
  void **head_1;
  void **head;
  pair<Kernel::TermList,_Kernel::TermList> val;
  TermStack defArgs;
  ParseResult res;
  LispListReader iaRdr;
  LispListReader pRdr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda8;
  SMTLIB2 *this_02;
  undefined1 local_248 [16];
  anon_union_8_2_43a9448f_for_ParseResult_3 *local_238;
  anon_union_8_2_43a9448f_for_ParseResult_3 *paStack_230;
  void *local_228;
  float fStack_220;
  float fStack_21c;
  TermStack *local_210;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  void *local_1e8;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_8_2_43a9448f_for_ParseResult_3 local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  FixedSizeAllocator<48UL> *local_160;
  LExpr *local_158;
  string *local_150;
  TermList local_148;
  Iterator local_140;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  LExpr *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  string local_50;
  
  local_158 = body;
  bVar5 = isAlreadyKnownSymbol(this,name);
  if (bVar5) {
    puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   "Redeclaring function symbol: ",name);
    plVar17 = (long *)std::__cxx11::string::append(local_208);
    local_248._0_8_ = *plVar17;
    ppaVar21 = (anon_union_8_2_43a9448f_for_ParseResult_3 **)(plVar17 + 2);
    if ((anon_union_8_2_43a9448f_for_ParseResult_3 **)local_248._0_8_ == ppaVar21) {
      local_238 = *ppaVar21;
      paStack_230 = (anon_union_8_2_43a9448f_for_ParseResult_3 *)plVar17[3];
      local_248._0_8_ = &local_238;
    }
    else {
      local_238 = *ppaVar21;
    }
    local_248._8_8_ = plVar17[1];
    *plVar17 = (long)ppaVar21;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    Shell::LispParser::Expression::toString_abi_cxx11_(&local_180,this->_topLevelExpr,true);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   in_stack_fffffffffffffda8);
    plVar17 = (long *)std::__cxx11::string::append(local_1d8);
    local_70 = (long *)*plVar17;
    plVar22 = plVar17 + 2;
    if (local_70 == plVar22) {
      local_60 = *plVar22;
      uStack_58 = (undefined4)plVar17[3];
      uStack_54 = *(undefined4 *)((long)plVar17 + 0x1c);
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar22;
    }
    local_68 = plVar17[1];
    *plVar17 = (long)plVar22;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    *puVar16 = &PTR_cry_00b3dfc0;
    puVar16[1] = puVar16 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar16 + 1),local_70,local_68 + (long)local_70);
    *puVar16 = &PTR_cry_00b3e0a8;
    *(undefined4 *)(puVar16 + 5) = 0;
    puVar16[6] = puVar16 + 8;
    puVar16[7] = 0;
    *(undefined1 *)(puVar16 + 8) = 0;
    __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  }
  local_f8 = oSort;
  TVar7 = parseSort(this,oSort);
  pDVar8 = (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
            *)Lib::FixedSizeAllocator<48UL>::alloc
                        ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  pDVar8->_timestamp = 1;
  pDVar8->_size = 0;
  pDVar8->_deleted = 0;
  pDVar8->_capacityIndex = 0;
  pDVar8->_capacity = 0;
  *(undefined8 *)&pDVar8->_nextExpansionOccupancy = 0;
  *(undefined8 *)((long)&pDVar8->_entries + 4) = 0;
  *(undefined4 *)((long)&pDVar8->_afterLast + 4) = 0;
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::argSorts == '\0') {
    readDefineFun();
  }
  local_160 = (FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60);
  readDefineFun::argSorts._cursor = readDefineFun::argSorts._stack;
  local_148 = TVar7;
  if (readDefineFun(std::__cxx11::string_const&,Lib::List<Shell::LispParser::Expression*>*,Shell::LispParser::Expression*,Shell::LispParser::Expression*,Lib::Stack<Kernel::TermList>const&,bool)
      ::args == '\0') {
    readDefineFun();
  }
  pTVar2 = typeArgs->_cursor;
  readDefineFun::args._cursor = readDefineFun::args._stack;
  local_150 = name;
  local_210 = typeArgs;
  pTVar18 = readDefineFun::args._end;
  for (pTVar23 = typeArgs->_stack; pTVar23 != pTVar2; pTVar23 = pTVar23 + 1) {
    uVar3 = pTVar23->_content;
    if (readDefineFun::args._cursor == pTVar18) {
      Lib::Stack<Kernel::TermList>::expand(&readDefineFun::args);
      pTVar18 = readDefineFun::args._end;
    }
    (readDefineFun::args._cursor)->_content = uVar3;
    readDefineFun::args._cursor = readDefineFun::args._cursor + 1;
  }
  local_140._lst = iArgs;
  if (iArgs != (LExprList *)0x0) {
    do {
      local_d0._M_dataplus._M_p =
           (pointer)Shell::LispListReader::readList((LispListReader *)&local_140);
      Shell::LispListReader::readAtom_abi_cxx11_((string *)local_1d8,(LispListReader *)&local_d0);
      sExpr = Shell::LispListReader::readNext((LispListReader *)&local_d0);
      TVar7 = parseSort(this,sExpr);
      Shell::LispListReader::acceptEOL((LispListReader *)&local_d0);
      uVar6 = this->_nextVar;
      this->_nextVar = uVar6 + 1;
      if (readDefineFun::args._cursor == readDefineFun::args._end) {
        Lib::Stack<Kernel::TermList>::expand(&readDefineFun::args);
      }
      TVar25._content._4_4_ = 0;
      TVar25._content._0_4_ = uVar6 * 4 + 1;
      (readDefineFun::args._cursor)->_content = TVar25._content;
      readDefineFun::args._cursor = readDefineFun::args._cursor + 1;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f0,local_1d8._0_8_,
                 (pointer)(local_1d8._0_8_ + CONCAT71(local_1d8._9_7_,local_1d8[8])));
      val.second._content = TVar7._content;
      val.first._content = TVar25._content;
      bVar5 = Lib::
              DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
              ::insert(pDVar8,&local_f0,val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) {
        puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
        std::operator+(&local_118,"Multiple occurrence of variable ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1d8);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_118);
        local_1a0._M_dataplus._M_p = (pointer)*plVar17;
        psVar19 = (size_type *)(plVar17 + 2);
        if ((size_type *)local_1a0._M_dataplus._M_p == psVar19) {
          local_1a0.field_2._M_allocated_capacity = *psVar19;
          local_1a0.field_2._8_8_ = plVar17[3];
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar19;
        }
        local_1a0._M_string_length = plVar17[1];
        *plVar17 = (long)psVar19;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        std::operator+(&local_180,&local_1a0,local_150);
        plVar17 = (long *)std::__cxx11::string::append((char *)&local_180);
        local_208._0_8_ = *plVar17;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar17 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._0_8_ == paVar20) {
          local_1f8._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_1f8._8_8_ = plVar17[3];
          local_208._0_8_ = &local_1f8;
        }
        else {
          local_1f8._M_allocated_capacity = paVar20->_M_allocated_capacity;
        }
        local_208._8_8_ = plVar17[1];
        *plVar17 = (long)paVar20;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        Shell::LispParser::Expression::toString_abi_cxx11_(&local_138,this->_topLevelExpr,true);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                       in_stack_fffffffffffffda8);
        plVar17 = (long *)std::__cxx11::string::append(local_248);
        local_90 = (long *)*plVar17;
        plVar22 = plVar17 + 2;
        if (local_90 == plVar22) {
          local_80 = *plVar22;
          uStack_78 = (undefined4)plVar17[3];
          uStack_74 = *(undefined4 *)((long)plVar17 + 0x1c);
          local_90 = &local_80;
        }
        else {
          local_80 = *plVar22;
        }
        local_88 = plVar17[1];
        *plVar17 = (long)plVar22;
        plVar17[1] = 0;
        *(undefined1 *)(plVar17 + 2) = 0;
        *puVar16 = &PTR_cry_00b3dfc0;
        puVar16[1] = puVar16 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar16 + 1),local_90,local_88 + (long)local_90);
        *puVar16 = &PTR_cry_00b3e0a8;
        *(undefined4 *)(puVar16 + 5) = 0;
        puVar16[6] = puVar16 + 8;
        puVar16[7] = 0;
        *(undefined1 *)(puVar16 + 8) = 0;
        __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
                    Lib::UserErrorException::~UserErrorException);
      }
      if (readDefineFun::argSorts._cursor == readDefineFun::argSorts._end) {
        Lib::Stack<Kernel::TermList>::expand(&readDefineFun::argSorts);
      }
      (readDefineFun::argSorts._cursor)->_content = TVar7._content;
      readDefineFun::argSorts._cursor = readDefineFun::argSorts._cursor + 1;
      if ((undefined1 *)local_1d8._0_8_ != local_1d8 + 0x10) {
        operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ + 1);
      }
    } while (local_140._lst != (LExprList *)0x0);
  }
  ppDVar9 = (this->_scopes)._cursor;
  this_02 = this;
  if (ppDVar9 == (this->_scopes)._end) {
    Lib::
    Stack<Lib::DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>_*>
    ::expand(&this->_scopes);
    ppDVar9 = (this->_scopes)._cursor;
  }
  TVar7._content = local_148._content;
  name_00 = local_150;
  *ppDVar9 = pDVar8;
  pppDVar1 = &(this->_scopes)._cursor;
  *pppDVar1 = *pppDVar1 + 1;
  DVar10.first = 0;
  DVar10.second = FUNCTION;
  SVar26 = FUNCTION;
  if (recursive) {
    DVar10 = declareFunctionOrPredicate
                       (this,local_150,local_148,&readDefineFun::argSorts,
                        (uint)((ulong)((long)local_210->_cursor - (long)local_210->_stack) >> 3));
    SVar26 = DVar10.second;
  }
  parseTermOrFormula((ParseResult *)local_1d8,this,local_158,false);
  ppDVar9 = (this->_scopes)._cursor;
  (this->_scopes)._cursor = ppDVar9 + -1;
  pDVar8 = ppDVar9[-1];
  if (pDVar8 != (DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
                 *)0x0) {
    Lib::
    DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<Kernel::TermList,_Kernel::TermList>,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::~DHMap(pDVar8);
    pDVar8->_timestamp = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_4_;
    pDVar8->_size = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._116_4_;
    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pDVar8;
  }
  arg2 = local_1a8;
  if ((bool)local_1d8[8] == true) {
    arg2.frm = (Formula *)Kernel::Term::createFormula(local_1a8.frm);
    local_1d8._0_8_ = Kernel::AtomicSort::boolSort();
  }
  if (local_1d8._0_8_ == TVar7._content) {
    if (!recursive) {
      DVar10 = declareFunctionOrPredicate
                         (this_02,name_00,TVar7,&readDefineFun::argSorts,
                          (uint)((ulong)((long)local_210->_cursor - (long)local_210->_stack) >> 3));
      SVar26 = DVar10.second;
    }
    uVar6 = DVar10.first;
    if (SVar26 == FUNCTION) {
      pSVar27 = (DAT_00b521b0->_funs)._stack[(ulong)DVar10 & 0xffffffff];
      pTVar14 = Kernel::Term::create
                          (uVar6,(uint)((ulong)((long)readDefineFun::args._cursor -
                                               (long)readDefineFun::args._stack) >> 3),
                           readDefineFun::args._stack);
      uVar6 = Kernel::Signature::getFnDef(DAT_00b521b0,uVar6);
      Lib::Stack<Kernel::TermList>::Stack((Stack<Kernel::TermList> *)local_248,local_210);
      this_01 = local_160;
      if (local_238 == paStack_230) {
        Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)local_248);
      }
      local_238->frm = (Formula *)pTVar14;
      local_238 = local_238 + 1;
      if (local_238 == paStack_230) {
        Lib::Stack<Kernel::TermList>::expand((Stack<Kernel::TermList> *)local_248);
      }
      local_238->frm = (Formula *)arg2;
      local_238 = local_238 + 1;
      pLVar11 = Kernel::Literal::create
                          (uVar6,(uint)((ulong)((long)local_238 - local_248._8_8_) >> 3),true,
                           (TermList *)local_248._8_8_);
      if ((TermList *)local_248._8_8_ != (TermList *)0x0) {
        uVar15 = local_248._0_8_ * 8 + 0xfU & 0xfffffffffffffff0;
        if (uVar15 == 0) {
          *(uint64_t *)local_248._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x11) {
          *(uint64_t *)local_248._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x19) {
          *(uint64_t *)local_248._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x21) {
          *(uint64_t *)local_248._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x31) {
          *(uint64_t *)local_248._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_248._8_8_;
        }
        else if (uVar15 < 0x41) {
          *(uint64_t *)local_248._8_8_ = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_248._8_8_;
        }
        else {
          operator_delete((void *)local_248._8_8_,0x10);
        }
      }
    }
    else {
      pSVar27 = (DAT_00b521b0->_preds)._stack[(ulong)DVar10 & 0xffffffff];
      uVar6 = Kernel::Signature::getBoolDef(DAT_00b521b0,uVar6);
      this_01 = local_160;
      formula = (Formula *)Lib::FixedSizeAllocator<48UL>::alloc(local_160);
      pLVar11 = Kernel::Literal::create
                          (uVar6,(uint)((ulong)((long)readDefineFun::args._cursor -
                                               (long)readDefineFun::args._stack) >> 3),true,
                           readDefineFun::args._stack);
      formula->_connective = LITERAL;
      (formula->_label)._M_dataplus._M_p = (pointer)&(formula->_label).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&formula->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
                 DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
      *(Literal **)(formula + 1) = pLVar11;
      TVar7._content = (uint64_t)Kernel::Term::createFormula(formula);
      pLVar11 = Kernel::Literal::createEquality(true,TVar7,arg2.trm,local_148);
    }
    puVar12 = (undefined4 *)Lib::FixedSizeAllocator<48UL>::alloc(this_01);
    *puVar12 = 0;
    *(undefined4 **)(puVar12 + 2) = puVar12 + 6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar12 + 2),Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Literal **)(puVar12 + 10) = pLVar11;
    pSVar27->field_0x40 = pSVar27->field_0x40 | 8;
    this_00 = (Unit *)::operator_new(0x48,8);
    local_180._M_dataplus._M_p._0_1_ = 1;
    Kernel::Inference::Inference((Inference *)local_208,(FromInput *)&local_180);
    local_228 = local_1e8;
    fStack_220 = fStack_1e0;
    fStack_21c = fStack_1dc;
    local_238 = (anon_union_8_2_43a9448f_for_ParseResult_3 *)local_1f8._M_allocated_capacity;
    paStack_230 = (anon_union_8_2_43a9448f_for_ParseResult_3 *)local_1f8._8_8_;
    local_248._0_8_ = local_208._0_8_;
    local_248._8_8_ = local_208._8_8_;
    Kernel::Unit::Unit(this_00,FORMULA,(Inference *)local_248);
    *(undefined4 **)(this_00 + 1) = puVar12;
    *(undefined8 *)&this_00[1]._inference = 3;
    Kernel::Unit::doUnitTracing(this_00);
    pLVar13 = (List<Kernel::Unit_*> *)
              Lib::FixedSizeAllocator<16UL>::alloc
                        ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    pLVar13->_head = this_00;
    pLVar13->_tail = (List<Kernel::Unit_*> *)0x0;
    pLVar4 = (this_02->_formulas)._last;
    pFVar24 = (FIFO *)&pLVar4->_tail;
    if (pLVar4 == (List<Kernel::Unit_*> *)0x0) {
      pFVar24 = &this_02->_formulas;
    }
    pFVar24->_first = pLVar13;
    (this_02->_formulas)._last = pLVar13;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._16_8_ != &local_1b8) {
      operator_delete((void *)local_1d8._16_8_,local_1b8._M_allocated_capacity + 1);
    }
    return;
  }
  puVar16 = (undefined8 *)__cxa_allocate_exception(0x50);
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_138,local_158,true);
  std::operator+(&local_118,"Defined function body ",&local_138);
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_1a0._M_dataplus._M_p = (pointer)*plVar17;
  psVar19 = (size_type *)(plVar17 + 2);
  if ((size_type *)local_1a0._M_dataplus._M_p == psVar19) {
    local_1a0.field_2._M_allocated_capacity = *psVar19;
    local_1a0.field_2._8_8_ = plVar17[3];
    local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  }
  else {
    local_1a0.field_2._M_allocated_capacity = *psVar19;
  }
  local_1a0._M_string_length = plVar17[1];
  *plVar17 = (long)psVar19;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_d0,local_f8,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                 in_stack_fffffffffffffda8);
  plVar17 = (long *)std::__cxx11::string::append((char *)&local_180);
  local_208._0_8_ = *plVar17;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar17 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._0_8_ == paVar20) {
    local_1f8._M_allocated_capacity = paVar20->_M_allocated_capacity;
    local_1f8._8_8_ = plVar17[3];
    local_208._0_8_ = &local_1f8;
  }
  else {
    local_1f8._M_allocated_capacity = paVar20->_M_allocated_capacity;
  }
  local_208._8_8_ = plVar17[1];
  *plVar17 = (long)paVar20;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_50,this_02->_topLevelExpr,true);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02,
                 in_stack_fffffffffffffda8);
  plVar17 = (long *)std::__cxx11::string::append(local_248);
  local_b0 = (long *)*plVar17;
  plVar22 = plVar17 + 2;
  if (local_b0 == plVar22) {
    local_a0 = *plVar22;
    uStack_98 = (undefined4)plVar17[3];
    uStack_94 = *(undefined4 *)((long)plVar17 + 0x1c);
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar22;
  }
  local_a8 = plVar17[1];
  *plVar17 = (long)plVar22;
  plVar17[1] = 0;
  *(undefined1 *)(plVar17 + 2) = 0;
  *puVar16 = &PTR_cry_00b3dfc0;
  puVar16[1] = puVar16 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar16 + 1),local_b0,local_a8 + (long)local_b0);
  *puVar16 = &PTR_cry_00b3e0a8;
  *(undefined4 *)(puVar16 + 5) = 0;
  puVar16[6] = puVar16 + 8;
  puVar16[7] = 0;
  *(undefined1 *)(puVar16 + 8) = 0;
  __cxa_throw(puVar16,&Lib::UserErrorException::typeinfo,
              Lib::UserErrorException::~UserErrorException);
}

Assistant:

void SMTLIB2::readDefineFun(const std::string& name, LExprList* iArgs, LExpr* oSort, LExpr* body, const TermStack& typeArgs, bool recursive)
{
  if (isAlreadyKnownSymbol(name)) {
    USER_ERROR_EXPR("Redeclaring function symbol: "+name);
  }

  TermList rangeSort = parseSort(oSort);

  TermLookup* lookup = new TermLookup();

  static TermStack argSorts;
  argSorts.reset();

  static TermStack args;
  args.reset();
  for (const auto& ta : typeArgs) {
    args.push(ta);
  }

  LispListReader iaRdr(iArgs);
  while (iaRdr.hasNext()) {
    LExprList* pair = iaRdr.readList();
    LispListReader pRdr(pair);

    std::string vName = pRdr.readAtom();
    TermList vSort = parseSort(pRdr.readNext());

    pRdr.acceptEOL();

    TermList arg = TermList::var(_nextVar++);
    args.push(arg);

    if (!lookup->insert(vName,make_pair(arg,vSort))) {
      USER_ERROR_EXPR("Multiple occurrence of variable "+vName+" in the definition of function "+name);
    }

    argSorts.push(vSort);
  }

  _scopes.push(lookup);

  DeclaredSymbol fun;
  if (recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  ParseResult res = parseTermOrFormula(body,false/*isSort*/);

  delete _scopes.pop();

  TermList rhs;
  if (res.asTerm(rhs) != rangeSort) {
    USER_ERROR_EXPR("Defined function body "+body->toString()+" has different sort than declared "+oSort->toString());
  }

  if (!recursive) {
    fun = declareFunctionOrPredicate(name, rangeSort, argSorts, typeArgs.size());
  }

  unsigned symbIdx = fun.first;
  ASS(fun.second != SymbolType::TYPECON);
  bool isTrueFun = fun.second==SymbolType::FUNCTION;

  Literal* lit;
  Signature::Symbol* sym;
  if (isTrueFun) {
    sym = env.signature->getFunction(symbIdx);

    TermList lhs(Term::create(symbIdx,args.size(),args.begin()));
    auto p = env.signature->getFnDef(symbIdx);
    auto defArgs = typeArgs;
    defArgs.push(lhs);
    defArgs.push(rhs);
    lit = Literal::create(p,defArgs.size(),true,defArgs.begin());
  } else {
    sym = env.signature->getPredicate(symbIdx);

    auto p = env.signature->getBoolDef(symbIdx);
    TermList lhs(Term::createFormula(new AtomicFormula(Literal::create(p,args.size(),true,args.begin()))));
    lit = Literal::createEquality(true, lhs, rhs, rangeSort);
  }
  Formula* fla = new AtomicFormula(lit);

  // Mark original symbol protected to avoid
  // erroneous unused symbol elimination later.
  // TODO find a better way to do this
  sym->markProtected();

  FormulaUnit* fu = new FormulaUnit(fla, FromInput(UnitInputType::ASSUMPTION));

  _formulas.pushBack(fu);
}